

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxGetDefaultByType::Emit(FxGetDefaultByType *this,VMFunctionBuilder *build)

{
  uint uVar1;
  uint uVar2;
  uint extraout_var;
  uint opa;
  ExpEmit EVar4;
  ulong uVar3;
  
  uVar1 = (*this->Self->_vptr_FxExpression[9])();
  uVar3 = CONCAT44(extraout_var,uVar1);
  if (((extraout_var & 0x100) == 0) && ((uVar3 & 0x100fc0000) == 0)) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + ((uint)(uVar3 >> 0x10) & 3),uVar1 & 0xffff,uVar1 >> 0x18);
    uVar2 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
  }
  else {
    uVar2 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
    if ((extraout_var & 1) != 0) {
      opa = uVar2 & 0xffff;
      VMFunctionBuilder::Emit(build,5,opa,(VM_SHALF)uVar1);
      uVar3 = (ulong)uVar2;
      goto LAB_00535fab;
    }
  }
  opa = uVar2 & 0xffff;
LAB_00535fab:
  uVar1 = VMFunctionBuilder::GetConstantInt(build,0xe8);
  VMFunctionBuilder::Emit(build,0x1c,opa,(uint)uVar3 & 0xffff,uVar1);
  EVar4._0_4_ = opa | 0x1030000;
  EVar4.Konst = false;
  EVar4.Fixed = false;
  EVar4.Final = false;
  EVar4.Target = false;
  return EVar4;
}

Assistant:

ExpEmit FxGetDefaultByType::Emit(VMFunctionBuilder *build)
{
	ExpEmit op = Self->Emit(build);
	op.Free(build);
	ExpEmit to(build, REGT_POINTER);
	if (op.Konst)
	{
		build->Emit(OP_LKP, to.RegNum, op.RegNum);
		op = to;
	}
	build->Emit(OP_LO, to.RegNum, op.RegNum, build->GetConstantInt(myoffsetof(PClass, Defaults)));
	return to;
}